

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

Apply * __thiscall jsonnet::internal::Desugarer::type(Desugarer *this,AST *v)

{
  Apply *this_00;
  AST *in_stack_000000f8;
  UString *in_stack_00000100;
  Desugarer *in_stack_00000108;
  allocator<char32_t> *in_stack_ffffffffffffffd0;
  char32_t *in_stack_ffffffffffffffd8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffffe0;
  
  ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2a9e77);
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  this_00 = stdFunc(in_stack_00000108,in_stack_00000100,in_stack_000000f8);
  ::std::__cxx11::u32string::~u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             this_00);
  ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2a9ebe);
  return this_00;
}

Assistant:

Apply *type(AST *v)
    {
        return stdFunc(U"type", v);
    }